

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

void resizetab(lua_State *L,GCtab *t,uint32_t asize,uint32_t hbits)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  void *pvVar5;
  void *pvVar6;
  TValue *pTVar7;
  TValue *pTVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  TValue *oarray;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  int iVar20;
  undefined1 auVar19 [16];
  
  uVar14 = (ulong)asize;
  uVar10 = (ulong)(t->node).ptr32;
  uVar11 = t->asize;
  uVar15 = (ulong)uVar11;
  uVar1 = t->hmask;
  if (uVar11 < asize) {
    if (0x8000001 < asize) goto LAB_0010a21c;
    pvVar6 = (void *)(ulong)(t->array).ptr32;
    if (t->colo < '\x01') {
      pvVar5 = lj_mem_realloc(L,pvVar6,uVar11 * 8,asize * 8);
    }
    else {
      pvVar5 = lj_mem_realloc(L,(void *)0x0,0,asize * 8);
      t->colo = t->colo | 0x80;
      if (uVar15 != 0) {
        uVar12 = 0;
        do {
          *(undefined8 *)((long)pvVar5 + uVar12 * 8) = *(undefined8 *)((long)pvVar6 + uVar12 * 8);
          uVar12 = uVar12 + 1;
        } while (uVar15 != uVar12);
      }
    }
    (t->array).ptr32 = (uint32_t)pvVar5;
    t->asize = asize;
    auVar4 = _DAT_00155c60;
    auVar3 = _DAT_00155c50;
    auVar2 = _DAT_00155c40;
    if (uVar11 < asize) {
      lVar9 = (asize - uVar15) + -1;
      auVar16._8_4_ = (int)lVar9;
      auVar16._0_8_ = lVar9;
      auVar16._12_4_ = (int)((ulong)lVar9 >> 0x20);
      uVar12 = 0;
      auVar16 = auVar16 ^ _DAT_00155c60;
      do {
        auVar18._8_4_ = (int)uVar12;
        auVar18._0_8_ = uVar12;
        auVar18._12_4_ = (int)(uVar12 >> 0x20);
        auVar19 = (auVar18 | auVar3) ^ auVar4;
        iVar17 = auVar16._4_4_;
        if ((bool)(~(auVar19._4_4_ == iVar17 && auVar16._0_4_ < auVar19._0_4_ ||
                    iVar17 < auVar19._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar5 + uVar12 * 8 + uVar15 * 8 + 4) = 0xffffffff;
        }
        if ((auVar19._12_4_ != auVar16._12_4_ || auVar19._8_4_ <= auVar16._8_4_) &&
            auVar19._12_4_ <= auVar16._12_4_) {
          *(undefined4 *)((long)pvVar5 + uVar12 * 8 + uVar15 * 8 + 0xc) = 0xffffffff;
        }
        auVar18 = (auVar18 | auVar2) ^ auVar4;
        iVar20 = auVar18._4_4_;
        if (iVar20 <= iVar17 && (iVar20 != iVar17 || auVar18._0_4_ <= auVar16._0_4_)) {
          *(undefined4 *)((long)pvVar5 + uVar12 * 8 + uVar15 * 8 + 0x14) = 0xffffffff;
          *(undefined4 *)((long)pvVar5 + uVar12 * 8 + uVar15 * 8 + 0x1c) = 0xffffffff;
        }
        uVar12 = uVar12 + 4;
      } while (((asize - uVar15) + 3 & 0xfffffffffffffffc) != uVar12);
    }
  }
  if (hbits == 0) {
    (t->node).ptr32 = (L->glref).ptr32 + 0x68;
    t->hmask = 0;
  }
  else {
    if (0x1a < hbits) {
LAB_0010a21c:
      lj_err_msg(L,LJ_ERR_TABOV);
    }
    uVar13 = 1 << ((byte)hbits & 0x1f);
    uVar12 = (ulong)uVar13;
    pvVar6 = lj_mem_realloc(L,(void *)0x0,0,(MSize)(0x18L << ((byte)hbits & 0x3f)));
    *(uint32_t *)((long)pvVar6 + 0x14) = (uint32_t)pvVar6 + uVar13 * 0x18;
    (t->node).ptr32 = (uint32_t)pvVar6;
    t->hmask = uVar13 - 1;
    lVar9 = ((ulong)pvVar6 & 0xffffffff) + 0x10;
    do {
      *(undefined8 *)(lVar9 + -4) = 0xffffffff;
      *(undefined4 *)(lVar9 + -0xc) = 0xffffffff;
      lVar9 = lVar9 + 0x18;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  if (asize < uVar11) {
    pvVar6 = (void *)(ulong)(t->array).ptr32;
    t->asize = asize;
    do {
      if (*(int *)((long)pvVar6 + uVar14 * 8 + 4) != -1) {
        pTVar7 = lj_tab_setinth(L,t,(int32_t)uVar14);
        *pTVar7 = *(TValue *)((long)pvVar6 + uVar14 * 8);
      }
      uVar14 = uVar14 + 1;
    } while (uVar15 != uVar14);
    if (t->colo < '\x01') {
      pvVar6 = lj_mem_realloc(L,pvVar6,uVar11 << 3,asize << 3);
      (t->array).ptr32 = (uint32_t)pvVar6;
    }
  }
  if (uVar1 != 0) {
    uVar14 = 0;
    do {
      if (*(int *)(uVar10 + 4 + uVar14 * 0x18) != -1) {
        pTVar7 = (TValue *)(uVar10 + uVar14 * 0x18);
        pTVar8 = lj_tab_set(L,t,pTVar7 + 1);
        *pTVar8 = *pTVar7;
      }
      uVar11 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar11;
    } while (uVar11 <= uVar1);
    uVar14 = (ulong)(L->glref).ptr32;
    lVar9 = (ulong)(uVar1 + 1) * 0x18;
    *(int *)(uVar14 + 0x20) = *(int *)(uVar14 + 0x20) - (int)lVar9;
    (**(code **)(uVar14 + 0x10))
              (*(undefined8 *)(uVar14 + 0x18),uVar10,lVar9,0,*(code **)(uVar14 + 0x10));
    return;
  }
  return;
}

Assistant:

static void resizetab(lua_State *L, GCtab *t, uint32_t asize, uint32_t hbits)
{
  Node *oldnode = noderef(t->node);
  uint32_t oldasize = t->asize;
  uint32_t oldhmask = t->hmask;
  if (asize > oldasize) {  /* Array part grows? */
    TValue *array;
    uint32_t i;
    if (asize > LJ_MAX_ASIZE)
      lj_err_msg(L, LJ_ERR_TABOV);
    if (LJ_MAX_COLOSIZE != 0 && t->colo > 0) {
      /* A colocated array must be separated and copied. */
      TValue *oarray = tvref(t->array);
      array = lj_mem_newvec(L, asize, TValue);
      t->colo = (int8_t)(t->colo | 0x80);  /* Mark as separated (colo < 0). */
      for (i = 0; i < oldasize; i++)
	copyTV(L, &array[i], &oarray[i]);
    } else {
      array = (TValue *)lj_mem_realloc(L, tvref(t->array),
			  oldasize*sizeof(TValue), asize*sizeof(TValue));
    }
    setmref(t->array, array);
    t->asize = asize;
    for (i = oldasize; i < asize; i++)  /* Clear newly allocated slots. */
      setnilV(&array[i]);
  }
  /* Create new (empty) hash part. */
  if (hbits) {
    newhpart(L, t, hbits);
    clearhpart(t);
  } else {
    global_State *g = G(L);
    setmref(t->node, &g->nilnode);
    t->hmask = 0;
  }
  if (asize < oldasize) {  /* Array part shrinks? */
    TValue *array = tvref(t->array);
    uint32_t i;
    t->asize = asize;  /* Note: This 'shrinks' even colocated arrays. */
    for (i = asize; i < oldasize; i++)  /* Reinsert old array values. */
      if (!tvisnil(&array[i]))
	copyTV(L, lj_tab_setinth(L, t, (int32_t)i), &array[i]);
    /* Physically shrink only separated arrays. */
    if (LJ_MAX_COLOSIZE != 0 && t->colo <= 0)
      setmref(t->array, lj_mem_realloc(L, array,
	      oldasize*sizeof(TValue), asize*sizeof(TValue)));
  }
  if (oldhmask > 0) {  /* Reinsert pairs from old hash part. */
    global_State *g;
    uint32_t i;
    for (i = 0; i <= oldhmask; i++) {
      Node *n = &oldnode[i];
      if (!tvisnil(&n->val))
	copyTV(L, lj_tab_set(L, t, &n->key), &n->val);
    }
    g = G(L);
    lj_mem_freevec(g, oldnode, oldhmask+1, Node);
  }
}